

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_SignUpdate(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pPart,CK_ULONG ulPartLen)

{
  int iVar1;
  Session *this_00;
  MacAlgorithm *pMVar2;
  long in_RDX;
  long in_RDI;
  Session *session;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == 0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession((HandleManager *)pPart,ulPartLen);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 5) {
        pMVar2 = Session::getMacOp(this_00);
        if (pMVar2 == (MacAlgorithm *)0x0) {
          local_8 = AsymSignUpdate((Session *)this,(CK_BYTE_PTR)hSession,(CK_ULONG)pPart);
        }
        else {
          local_8 = MacSignUpdate((Session *)this,(CK_BYTE_PTR)hSession,(CK_ULONG)pPart);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_SignUpdate(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pPart, CK_ULONG ulPartLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pPart == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_SIGN)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacSignUpdate(session, pPart, ulPartLen);
	else
		return AsymSignUpdate(session, pPart, ulPartLen);
}